

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

nk_bool nk_do_button(nk_flags *state,nk_command_buffer *out,nk_rect r,nk_style_button *style,
                    nk_input *in,nk_button_behavior behavior,nk_rect *content)

{
  nk_rect r_00;
  undefined8 in_RCX;
  long in_RDX;
  long in_RSI;
  undefined4 in_R8D;
  float *in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  nk_rect bounds;
  float local_14;
  float fStack_10;
  float local_c;
  float fStack_8;
  nk_bool local_4;
  
  if ((in_RSI == 0) || (in_RDX == 0)) {
    local_4 = 0;
  }
  else {
    local_14 = (float)in_XMM0_Qa;
    *in_R9 = local_14 + *(float *)(in_RDX + 0x80) + *(float *)(in_RDX + 0x78) +
             *(float *)(in_RDX + 0x7c);
    fStack_10 = (float)((ulong)in_XMM0_Qa >> 0x20);
    in_R9[1] = fStack_10 + *(float *)(in_RDX + 0x84) + *(float *)(in_RDX + 0x78) +
               *(float *)(in_RDX + 0x7c);
    local_c = (float)in_XMM1_Qa;
    in_R9[2] = local_c - (*(float *)(in_RDX + 0x7c) + *(float *)(in_RDX + 0x7c) +
                         *(float *)(in_RDX + 0x80) + *(float *)(in_RDX + 0x80) +
                         *(float *)(in_RDX + 0x78));
    fStack_8 = (float)((ulong)in_XMM1_Qa >> 0x20);
    in_R9[3] = fStack_8 -
               (*(float *)(in_RDX + 0x7c) + *(float *)(in_RDX + 0x7c) +
               *(float *)(in_RDX + 0x84) + *(float *)(in_RDX + 0x84) + *(float *)(in_RDX + 0x78));
    r_00._4_8_ = in_RCX;
    r_00.x = (float)in_R8D;
    r_00.h = (float)in_RDX;
    local_4 = nk_button_behavior((nk_flags *)in_R9,r_00,
                                 (nk_input *)
                                 CONCAT44(*(float *)(in_RDX + 0x94) + *(float *)(in_RDX + 0x94) +
                                          fStack_8,*(float *)(in_RDX + 0x90) +
                                                   *(float *)(in_RDX + 0x90) + local_c),
                                 (nk_button_behavior)(fStack_10 - *(float *)(in_RDX + 0x94)));
  }
  return local_4;
}

Assistant:

NK_LIB nk_bool
nk_do_button(nk_flags *state, struct nk_command_buffer *out, struct nk_rect r,
const struct nk_style_button *style, const struct nk_input *in,
enum nk_button_behavior behavior, struct nk_rect *content)
{
struct nk_rect bounds;
NK_ASSERT(style);
NK_ASSERT(state);
NK_ASSERT(out);
if (!out || !style)
return nk_false;

/* calculate button content space */
content->x = r.x + style->padding.x + style->border + style->rounding;
content->y = r.y + style->padding.y + style->border + style->rounding;
content->w = r.w - (2 * style->padding.x + style->border + style->rounding*2);
content->h = r.h - (2 * style->padding.y + style->border + style->rounding*2);

/* execute button behavior */
bounds.x = r.x - style->touch_padding.x;
bounds.y = r.y - style->touch_padding.y;
bounds.w = r.w + 2 * style->touch_padding.x;
bounds.h = r.h + 2 * style->touch_padding.y;
return nk_button_behavior(state, bounds, in, behavior);
}